

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::Parser(Parser *this,Callbacks *cb,ParserOptions opts)

{
  code *pcVar1;
  pfn_allocate p_Var2;
  pfn_free p_Var3;
  pfn_error p_Var4;
  bool bVar5;
  long lVar6;
  State local_b8;
  
  (this->m_options).flags = opts.flags;
  (this->m_file).str = (char *)0x0;
  (this->m_file).len = 0;
  (this->m_buf).str = (char *)0x0;
  (this->m_buf).len = 0;
  this->m_root_id = 0xffffffffffffffff;
  this->m_tree = (Tree *)0x0;
  lVar6 = 0x40;
  do {
    *(undefined4 *)((long)(this->m_stack).m_buf + lVar6 + -0x40) = 0;
    memset((void *)((long)(this->m_stack).m_buf + lVar6 + -0x38),0,0x90);
    lVar6 = lVar6 + 0x98;
  } while (lVar6 != 0x9c0);
  (this->m_stack).m_stack = (this->m_stack).m_buf;
  (this->m_stack).m_size = 0;
  (this->m_stack).m_capacity = 0x10;
  p_Var2 = cb->m_allocate;
  p_Var3 = cb->m_free;
  p_Var4 = cb->m_error;
  (this->m_stack).m_callbacks.m_user_data = cb->m_user_data;
  (this->m_stack).m_callbacks.m_allocate = p_Var2;
  (this->m_stack).m_callbacks.m_free = p_Var3;
  (this->m_stack).m_callbacks.m_error = p_Var4;
  this->m_state = (State *)0x0;
  this->m_key_tag_indentation = 0;
  this->m_key_tag2_indentation = 0;
  (this->m_key_tag).str = (char *)0x0;
  (this->m_key_tag).len = 0;
  (this->m_key_tag2).str = (char *)0x0;
  (this->m_key_tag2).len = 0;
  this->m_val_tag_indentation = 0;
  (this->m_val_tag).str = (char *)0x0;
  (this->m_val_tag).len = 0;
  this->m_key_anchor_was_before = false;
  this->m_key_anchor_indentation = 0;
  (this->m_key_anchor).str = (char *)0x0;
  (this->m_key_anchor).len = 0;
  this->m_val_anchor_indentation = 0;
  (this->m_val_anchor).str = (char *)0x0;
  (this->m_val_anchor).len = 0;
  (this->m_filter_arena).str = (char *)0x0;
  (this->m_filter_arena).len = 0;
  this->m_newline_offsets = (size_t *)0x0;
  this->m_newline_offsets_size = 0;
  this->m_newline_offsets_capacity = 0;
  (this->m_newline_offsets_buf).str = (char *)0x0;
  (this->m_newline_offsets_buf).len = 0;
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  memset(&local_b8.level,0,0x90);
  detail::stack<c4::yml::Parser::State,_16UL>::push(&this->m_stack,&local_b8);
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_b8.flags = 0;
    local_b8._4_4_ = 0;
    local_b8.level = 0x5c5c;
    local_b8.node_id = 0;
    local_b8.scalar.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8.scalar.len = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  this->m_state = (this->m_stack).m_stack + ((this->m_stack).m_size - 1);
  return;
}

Assistant:

Parser::Parser(Callbacks const& cb, ParserOptions opts)
    : m_options(opts)
    , m_file()
    , m_buf()
    , m_root_id(NONE)
    , m_tree()
    , m_stack(cb)
    , m_state()
    , m_key_tag_indentation(0)
    , m_key_tag2_indentation(0)
    , m_key_tag()
    , m_key_tag2()
    , m_val_tag_indentation(0)
    , m_val_tag()
    , m_key_anchor_was_before(false)
    , m_key_anchor_indentation(0)
    , m_key_anchor()
    , m_val_anchor_indentation(0)
    , m_val_anchor()
    , m_filter_arena()
    , m_newline_offsets()
    , m_newline_offsets_size(0)
    , m_newline_offsets_capacity(0)
    , m_newline_offsets_buf()
{
    m_stack.push(State{});
    m_state = &m_stack.top();
}